

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall CP::vector<int>::vector(vector<int> *this,vector<int> *a)

{
  ulong uVar1;
  int *piVar2;
  int *__s;
  ulong uVar3;
  long lVar4;
  
  uVar1 = a->mCap;
  lVar4 = 0;
  uVar3 = -(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4;
  __s = (int *)operator_new__(uVar3);
  memset(__s,0,uVar3);
  this->mData = __s;
  this->mCap = uVar1;
  uVar1 = a->mSize;
  this->mSize = uVar1;
  piVar2 = a->mData;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    __s[uVar3] = *(int *)((long)piVar2 + (lVar4 >> 0x1e));
    lVar4 = lVar4 + 0x100000000;
  }
  return;
}

Assistant:

vector(const vector<T>& a) {
      mData = new T[a.capacity()]();
      mCap = a.capacity();
      mSize = a.size();
      for (size_t i = 0;i < a.size();i++) {
        mData[i] = a[i];
      }
    }